

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_unit_strings.cpp
# Opt level: O0

void __thiscall unitStrings_one_Test::TestBody(unitStrings_one_Test *this)

{
  bool bVar1;
  precise_unit *un;
  char *message;
  uint64_t in_RCX;
  AssertHelper local_80;
  Message local_78 [3];
  undefined1 local_60 [8];
  AssertionResult gtest_ar;
  string res;
  undefined1 local_20 [8];
  precise_unit funit;
  unitStrings_one_Test *this_local;
  
  funit._8_8_ = this;
  join_0x00000000_0x00001200_ =
       units::precise_unit::operator*
                 ((precise_unit *)units::precise::iflag,(precise_unit *)units::precise::pu);
  units::precise_unit::precise_unit
            ((precise_unit *)local_20,4.5,(precise_unit *)((long)&res.field_2 + 8));
  un = (precise_unit *)units::getDefaultFlags();
  units::to_string_abi_cxx11_((string *)&gtest_ar.message_,(units *)local_20,un,in_RCX);
  testing::internal::EqHelper::
  Compare<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_char[12],_nullptr>
            ((EqHelper *)local_60,"res","\"4.5*defunit\"",
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&gtest_ar.message_
             ,(char (*) [12])"4.5*defunit");
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_60);
  if (!bVar1) {
    testing::Message::Message(local_78);
    message = testing::AssertionResult::failure_message((AssertionResult *)local_60);
    testing::internal::AssertHelper::AssertHelper
              (&local_80,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/LLNL[P]units/test/test_unit_strings.cpp"
               ,0x130,message);
    testing::internal::AssertHelper::operator=(&local_80,local_78);
    testing::internal::AssertHelper::~AssertHelper(&local_80);
    testing::Message::~Message(local_78);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_60);
  std::__cxx11::string::~string((string *)&gtest_ar.message_);
  return;
}

Assistant:

TEST(unitStrings, one)
{
    auto funit = precise_unit(4.5, precise::iflag * precise::pu);
    auto res = to_string(funit);
    EXPECT_EQ(res, "4.5*defunit");
}